

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pztrnsform.cpp
# Opt level: O1

void __thiscall TPZTransform<Fad<double>_>::TPZTransform(TPZTransform<Fad<double>_> *this,int dim)

{
  Fad<double> *pFVar1;
  long lVar2;
  ulong uVar3;
  Fad<double> local_50;
  
  (this->super_TPZSavable)._vptr_TPZSavable = (_func_int **)&PTR__TPZTransform_01895430;
  lVar2 = (long)dim;
  local_50.val_ = 0.0;
  local_50.dx_.num_elts = 0;
  local_50.dx_.ptr_to_data = (double *)0x0;
  local_50.defaultVal = 0.0;
  TPZFNMatrix<9,_Fad<double>_>::TPZFNMatrix(&this->fMult,lVar2,lVar2,&local_50);
  if (local_50.dx_.ptr_to_data != (double *)0x0) {
    operator_delete__(local_50.dx_.ptr_to_data);
  }
  local_50.val_ = 0.0;
  local_50.dx_.num_elts = 0;
  local_50.dx_.ptr_to_data = (double *)0x0;
  local_50.defaultVal = 0.0;
  TPZFNMatrix<3,_Fad<double>_>::TPZFNMatrix(&this->fSum,lVar2,1,&local_50);
  if (local_50.dx_.ptr_to_data != (double *)0x0) {
    operator_delete__(local_50.dx_.ptr_to_data);
  }
  this->fRow = dim;
  this->fCol = dim;
  memset((this->fMult).super_TPZFMatrix<Fad<double>_>.fElem,0,
         (this->fMult).super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
         super_TPZBaseMatrix.fRow *
         (this->fMult).super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
         super_TPZBaseMatrix.fCol * 0x20);
  (this->fMult).super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
  fDecomposed = '\0';
  memset((this->fSum).super_TPZFMatrix<Fad<double>_>.fElem,0,
         (this->fSum).super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
         super_TPZBaseMatrix.fRow *
         (this->fSum).super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
         super_TPZBaseMatrix.fCol * 0x20);
  (this->fSum).super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
  fDecomposed = '\0';
  if (0 < dim) {
    uVar3 = 0;
    do {
      if (((this->fMult).super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
           super_TPZBaseMatrix.fRow <= (long)uVar3) ||
         ((this->fMult).super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
          super_TPZBaseMatrix.fCol <= (long)uVar3)) {
        TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar2 = (this->fMult).super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
              super_TPZBaseMatrix.fRow * uVar3;
      pFVar1 = (this->fMult).super_TPZFMatrix<Fad<double>_>.fElem;
      pFVar1[lVar2 + uVar3].val_ = 1.0;
      if (pFVar1[lVar2 + uVar3].dx_.num_elts != 0) {
        local_50.val_ = 0.0;
        Vector<double>::operator=(&pFVar1[lVar2 + uVar3].dx_,&local_50.val_);
      }
      uVar3 = uVar3 + 1;
    } while ((uint)dim != uVar3);
  }
  return;
}

Assistant:

TPZTransform<T>::TPZTransform(int dim) :
fMult(dim,dim,0.), fSum(dim,1,0.) {
	fRow = dim;
	fCol = dim;
	fMult.Zero();
	fSum.Zero();
	int d;
	
	for(d=0; d<dim; d++) {
		fMult(d,d) = 1.;
	}
	
}